

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_4c9c8f::Handlers::beginUnderOverlay(Handlers *this,JSON *j)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer psVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  char *message;
  string file;
  undefined1 local_78 [32];
  JSON local_58;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  psVar2 = (pointer)(local_78 + 0x10);
  local_78._0_8_ = psVar2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"file","");
  JSON::getDictItem(&local_58,(string *)j);
  bVar3 = JSON::getString(&local_58,&local_48);
  if (local_58.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((pointer)local_78._0_8_ != psVar2) {
    operator_delete((void *)local_78._0_8_,
                    (ulong)((long)&((__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_78._16_8_)->_M_ptr + 1));
  }
  if (bVar3) {
    QPDFJob::UOConfig::file
              ((this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  message = "file is required in underlay/overlay specification";
  local_78._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"file is required in underlay/overlay specification","");
  usage((Handlers *)local_78,(string *)message);
  if ((pointer)local_78._0_8_ != psVar2) {
    operator_delete((void *)local_78._0_8_,
                    (ulong)((long)&((__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_78._16_8_)->_M_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
Handlers::beginUnderOverlay(JSON const& j)
{
    // File has to be processed before items, so handle it here.
    std::string file;
    if (!j.getDictItem("file").getString(file)) {
        QTC::TC("qpdf", "QPDFJob json over/under no file");
        usage("file is required in underlay/overlay specification");
    }
    c_uo->file(file);
}